

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.hpp
# Opt level: O1

void __thiscall jsonip::writer<false>::new_double(writer<false> *this,double d)

{
  if (this->comma == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->os,", ",2);
  }
  std::ostream::_M_insert<double>(d);
  this->comma = true;
  return;
}

Assistant:

void new_double(double d)
        {
            pre();
            os << d;
            comma = true;
        }